

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_remove_handle(Curl_multi *multi,Curl_easy *data)

{
  _Bool _Var1;
  curl_socket_t cVar2;
  Curl_message *msg;
  connectdata *pcStack_48;
  curl_socket_t s;
  connectdata *c;
  connectdata *pcStack_38;
  CURLMcode rc;
  Curl_llist_element *e;
  Curl_easy *pCStack_28;
  _Bool premature;
  Curl_easy *easy;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  if ((multi == (Curl_multi *)0x0) || (multi->magic != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if ((data == (Curl_easy *)0x0) || (data->magic != 0xc0dedbad)) {
    multi_local._4_4_ = CURLM_BAD_EASY_HANDLE;
  }
  else if (data->multi == (Curl_multi *)0x0) {
    multi_local._4_4_ = CURLM_OK;
  }
  else if (data->multi == multi) {
    if (((byte)multi->field_0x1b1 >> 2 & 1) == 0) {
      e._7_1_ = data->mstate < MSTATE_COMPLETED;
      if ((bool)e._7_1_) {
        multi->num_alive = multi->num_alive - 1;
      }
      pCStack_28 = data;
      easy = data;
      data_local = (Curl_easy *)multi;
      if (((data->conn != (connectdata *)0x0) && (MSTATE_DO < data->mstate)) &&
         (data->mstate < MSTATE_COMPLETED)) {
        Curl_conncontrol(data->conn,2);
      }
      if (easy->conn != (connectdata *)0x0) {
        multi_done(easy,easy->result,(_Bool)(e._7_1_ & 1));
      }
      Curl_expire_clear(easy);
      if ((easy->connect_queue).ptr != (void *)0x0) {
        if (easy->mstate == MSTATE_PENDING) {
          Curl_llist_remove((Curl_llist *)&data_local->conn_queue,&easy->connect_queue,(void *)0x0);
        }
        else {
          Curl_llist_remove((Curl_llist *)&data_local->msg,&easy->connect_queue,(void *)0x0);
        }
      }
      _Var1 = in_main_list(easy);
      if (_Var1) {
        unlink_easy((Curl_multi *)data_local,easy);
      }
      if ((easy->dns).hostcachetype == HCACHE_MULTI) {
        (easy->dns).hostcache = (Curl_hash *)0x0;
        (easy->dns).hostcachetype = HCACHE_NONE;
      }
      Curl_wildcard_dtor(&easy->wildcard);
      easy->mstate = MSTATE_COMPLETED;
      singlesocket((Curl_multi *)data_local,pCStack_28);
      Curl_detach_connection(easy);
      if ((((easy->set).connect_only != '\0') && (easy->multi_easy == (Curl_multi *)0x0)) &&
         ((cVar2 = Curl_getconnectinfo(easy,&stack0xffffffffffffffb8), cVar2 != -1 &&
          (pcStack_48 != (connectdata *)0x0)))) {
        Curl_conncache_remove_conn(easy,pcStack_48,true);
        Curl_disconnect(easy,pcStack_48,true);
      }
      if ((easy->state).lastconnect_id != -1) {
        Curl_conncache_foreach(easy,(easy->state).conn_cache,(void *)0x0,close_connect_only);
      }
      (easy->state).conn_cache = (conncache *)0x0;
      easy->multi = (Curl_multi *)0x0;
      for (pcStack_38 = data_local->conn; pcStack_38 != (connectdata *)0x0;
          pcStack_38 = (connectdata *)(pcStack_38->bundle_node).next) {
        if (*(Curl_easy **)((long)(pcStack_38->bundle_node).ptr + 0x20) == pCStack_28) {
          Curl_llist_remove((Curl_llist *)&data_local->conn,&pcStack_38->bundle_node,(void *)0x0);
          break;
        }
      }
      *(int *)&data_local->prev = *(int *)&data_local->prev + -1;
      process_pending_handles((Curl_multi *)data_local);
      multi_local._4_4_ = Curl_update_timer((Curl_multi *)data_local);
      if (multi_local._4_4_ == CURLM_OK) {
        multi_local._4_4_ = CURLM_OK;
      }
    }
    else {
      multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
    }
  }
  else {
    multi_local._4_4_ = CURLM_BAD_EASY_HANDLE;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_remove_handle(struct Curl_multi *multi,
                                   struct Curl_easy *data)
{
  struct Curl_easy *easy = data;
  bool premature;
  struct Curl_llist_element *e;
  CURLMcode rc;

  /* First, make some basic checks that the CURLM handle is a good handle */
  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* Verify that we got a somewhat good easy handle too */
  if(!GOOD_EASY_HANDLE(data))
    return CURLM_BAD_EASY_HANDLE;

  /* Prevent users from trying to remove same easy handle more than once */
  if(!data->multi)
    return CURLM_OK; /* it is already removed so let's say it is fine! */

  /* Prevent users from trying to remove an easy handle from the wrong multi */
  if(data->multi != multi)
    return CURLM_BAD_EASY_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  premature = (data->mstate < MSTATE_COMPLETED) ? TRUE : FALSE;

  /* If the 'state' is not INIT or COMPLETED, we might need to do something
     nice to put the easy_handle in a good known state when this returns. */
  if(premature) {
    /* this handle is "alive" so we need to count down the total number of
       alive connections when this is removed */
    multi->num_alive--;
  }

  if(data->conn &&
     data->mstate > MSTATE_DO &&
     data->mstate < MSTATE_COMPLETED) {
    /* Set connection owner so that the DONE function closes it.  We can
       safely do this here since connection is killed. */
    streamclose(data->conn, "Removed with partial response");
  }

  if(data->conn) {
    /* multi_done() clears the association between the easy handle and the
       connection.

       Note that this ignores the return code simply because there's
       nothing really useful to do with it anyway! */
    (void)multi_done(data, data->result, premature);
  }

  /* The timer must be shut down before data->multi is set to NULL, else the
     timenode will remain in the splay tree after curl_easy_cleanup is
     called. Do it after multi_done() in case that sets another time! */
  Curl_expire_clear(data);

  if(data->connect_queue.ptr) {
    /* the handle is in the pending or msgsent lists, so go ahead and remove
       it */
    if(data->mstate == MSTATE_PENDING)
      Curl_llist_remove(&multi->pending, &data->connect_queue, NULL);
    else
      Curl_llist_remove(&multi->msgsent, &data->connect_queue, NULL);
  }
  if(in_main_list(data))
    unlink_easy(multi, data);

  if(data->dns.hostcachetype == HCACHE_MULTI) {
    /* stop using the multi handle's DNS cache, *after* the possible
       multi_done() call above */
    data->dns.hostcache = NULL;
    data->dns.hostcachetype = HCACHE_NONE;
  }

  Curl_wildcard_dtor(&data->wildcard);

  /* change state without using multistate(), only to make singlesocket() do
     what we want */
  data->mstate = MSTATE_COMPLETED;

  /* This ignores the return code even in case of problems because there's
     nothing more to do about that, here */
  (void)singlesocket(multi, easy); /* to let the application know what sockets
                                      that vanish with this handle */

  /* Remove the association between the connection and the handle */
  Curl_detach_connection(data);

  if(data->set.connect_only && !data->multi_easy) {
    /* This removes a handle that was part the multi interface that used
       CONNECT_ONLY, that connection is now left alive but since this handle
       has bits.close set nothing can use that transfer anymore and it is
       forbidden from reuse. And this easy handle cannot find the connection
       anymore once removed from the multi handle

       Better close the connection here, at once.
    */
    struct connectdata *c;
    curl_socket_t s;
    s = Curl_getconnectinfo(data, &c);
    if((s != CURL_SOCKET_BAD) && c) {
      Curl_conncache_remove_conn(data, c, TRUE);
      Curl_disconnect(data, c, TRUE);
    }
  }

  if(data->state.lastconnect_id != -1) {
    /* Mark any connect-only connection for closure */
    Curl_conncache_foreach(data, data->state.conn_cache,
                           NULL, close_connect_only);
  }

#ifdef USE_LIBPSL
  /* Remove the PSL association. */
  if(data->psl == &multi->psl)
    data->psl = NULL;
#endif

  /* as this was using a shared connection cache we clear the pointer to that
     since we're not part of that multi handle anymore */
  data->state.conn_cache = NULL;

  data->multi = NULL; /* clear the association to this multi handle */

  /* make sure there's no pending message in the queue sent from this easy
     handle */
  for(e = multi->msglist.head; e; e = e->next) {
    struct Curl_message *msg = e->ptr;

    if(msg->extmsg.easy_handle == easy) {
      Curl_llist_remove(&multi->msglist, e, NULL);
      /* there can only be one from this specific handle */
      break;
    }
  }

  /* NOTE NOTE NOTE
     We do not touch the easy handle here! */
  multi->num_easy--; /* one less to care about now */

  process_pending_handles(multi);

  rc = Curl_update_timer(multi);
  if(rc)
    return rc;
  return CURLM_OK;
}